

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

uint16_t container_maximum(container_t *c,uint8_t type)

{
  short sVar1;
  long lVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  
  uVar4 = CONCAT71(in_register_00000031,type);
  if ((int)uVar4 == 4) {
    uVar4 = (ulong)*(byte *)((long)c + 8);
    c = *c;
  }
  if ((char)uVar4 == '\x03') {
    lVar2 = (long)*c;
    if (lVar2 != 0) {
      return *(short *)(*(long *)((long)c + 8) + -2 + lVar2 * 4) +
             *(short *)(*(long *)((long)c + 8) + -4 + lVar2 * 4);
    }
  }
  else {
    if ((char)uVar4 != '\x02') {
      sVar1 = 1;
      uVar3 = 0x3ff;
      while( true ) {
        if (uVar3 == 0) {
          return 0;
        }
        uVar4 = *(ulong *)(*(long *)((long)c + 8) + (ulong)uVar3 * 8);
        if (uVar4 != 0) break;
        sVar1 = sVar1 + 0x40;
        uVar3 = uVar3 - 1;
      }
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      return -(sVar1 + ((ushort)lVar2 ^ 0x3f));
    }
    if ((long)*c != 0) {
      return *(uint16_t *)(*(long *)((long)c + 8) + -2 + (long)*c * 2);
    }
  }
  return 0;
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}